

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

FT_Fast cf2_initGlobalRegionBuffer(PS_Decoder *decoder,FT_Fast subrNum,CF2_Buffer buf)

{
  FT_Byte *pFVar1;
  uint uVar2;
  bool bVar3;
  FT_UFast idx;
  CF2_Buffer buf_local;
  FT_Fast subrNum_local;
  PS_Decoder *decoder_local;
  
  memset(buf,0,0x20);
  uVar2 = subrNum + decoder->globals_bias;
  bVar3 = uVar2 < decoder->num_globals;
  if (bVar3) {
    pFVar1 = decoder->globals[uVar2];
    buf->ptr = pFVar1;
    buf->start = pFVar1;
    buf->end = decoder->globals[uVar2 + 1];
  }
  decoder_local._4_4_ = (uint)!bVar3;
  return decoder_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( CF2_Int )
  cf2_initGlobalRegionBuffer( PS_Decoder*  decoder,
                              CF2_Int      subrNum,
                              CF2_Buffer   buf )
  {
    CF2_UInt  idx;


    FT_ASSERT( decoder );

    FT_ZERO( buf );

    idx = (CF2_UInt)( subrNum + decoder->globals_bias );
    if ( idx >= decoder->num_globals )
      return TRUE;     /* error */

    FT_ASSERT( decoder->globals );

    buf->start =
    buf->ptr   = decoder->globals[idx];
    buf->end   = decoder->globals[idx + 1];

    return FALSE;      /* success */
  }